

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  int iVar1;
  int *piVar2;
  
  (this->super_BinaryReaderBase).super_ReaderBase.token_ =
       (this->super_BinaryReaderBase).super_ReaderBase.ptr_;
  piVar2 = (int *)BinaryReaderBase::Read(&this->super_BinaryReaderBase,4);
  iVar1 = EndiannessConverter::Convert<int>((EndiannessConverter *)this,*piVar2);
  return iVar1;
}

Assistant:

Int ReadInt() {
    token_ = ptr_;
    Int val;
    memcpy(&val, Read(sizeof(Int)), sizeof(Int));
    return this->Convert(val);
  }